

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

void __thiscall ON_PolynomialSurface::ON_PolynomialSurface(ON_PolynomialSurface *this)

{
  this->m_dim = 0;
  this->m_is_rat = 0;
  ON_4dPointArray::ON_4dPointArray(&this->m_cv);
  ON_Interval::ON_Interval((ON_Interval *)&this->field_0x28);
  ON_Interval::ON_Interval((ON_Interval *)&this->field_0x38);
  this->m_order[0] = 0;
  this->m_order[1] = 0;
  *(undefined4 *)&this->field_0x28 = 0;
  *(undefined4 *)&this->field_0x2c = 0;
  *(undefined4 *)&this->field_0x30 = 0;
  *(undefined4 *)&this->field_0x34 = 0x3ff00000;
  *(undefined4 *)&this->field_0x38 = 0;
  *(undefined4 *)&this->field_0x3c = 0;
  *(undefined4 *)&this->field_0x40 = 0;
  *(undefined4 *)&this->field_0x44 = 0x3ff00000;
  return;
}

Assistant:

ON_PolynomialSurface::ON_PolynomialSurface() : m_dim(0), m_is_rat(0)
{
  m_order[0] = 0;
  m_order[1] = 0;
  m_domain[0].m_t[0] = 0.0;
  m_domain[0].m_t[1] = 1.0;
  m_domain[1].m_t[0] = 0.0;
  m_domain[1].m_t[1] = 1.0;
}